

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdphuff.c
# Opt level: O2

void process_restart(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_component_info *pjVar3;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var4;
  boolean bVar5;
  long lVar6;
  
  pjVar1 = cinfo->entropy;
  bVar5 = (*cinfo->marker->read_restart_marker)(cinfo);
  if (bVar5 == 0) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x18;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  lVar6 = 0;
  do {
    if (cinfo->comps_in_scan <= lVar6) {
      pjVar1[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
      pjVar1[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
      pjVar1[1].insufficient_data = -0x10;
      *(uint *)((long)&pjVar1[3].start_pass + 4) = cinfo->restart_interval;
      return;
    }
    pjVar3 = cinfo->cur_comp_info[lVar6];
    if (cinfo->progressive_mode == 0) {
LAB_001281fa:
      p_Var4 = (&pjVar1[3].decode_mcu)[pjVar3->dc_tbl_no];
      *(undefined8 *)(p_Var4 + 0x30) = 0;
      *(undefined8 *)(p_Var4 + 0x38) = 0;
      *(undefined8 *)(p_Var4 + 0x20) = 0;
      *(undefined8 *)(p_Var4 + 0x28) = 0;
      *(undefined8 *)(p_Var4 + 0x10) = 0;
      *(undefined8 *)(p_Var4 + 0x18) = 0;
      *(undefined8 *)p_Var4 = 0;
      *(undefined8 *)(p_Var4 + 8) = 0;
      *(undefined4 *)(&pjVar1[1].field_0x14 + lVar6 * 4) = 0;
      *(undefined4 *)((long)&pjVar1[2].decode_mcu + lVar6 * 4 + 4) = 0;
      if ((cinfo->progressive_mode == 0) || (cinfo->Ss != 0)) {
LAB_00128233:
        memset(*(void **)(&pjVar1[8].insufficient_data + (long)pjVar3->ac_tbl_no * 2),0,0x100);
      }
    }
    else {
      if (cinfo->Ss != 0) goto LAB_00128233;
      if (cinfo->Ah == 0) goto LAB_001281fa;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

LOCAL(boolean)
process_restart(j_decompress_ptr cinfo)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  int ci;

  /* Throw away any unused bits remaining in bit buffer; */
  /* include any full bytes in next_marker's count of discarded bytes */
  cinfo->marker->discarded_bytes += entropy->bitstate.bits_left / 8;
  entropy->bitstate.bits_left = 0;

  /* Advance past the RSTn marker */
  if (!(*cinfo->marker->read_restart_marker) (cinfo))
    return FALSE;

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++)
    entropy->saved.last_dc_val[ci] = 0;
  /* Re-init EOB run count, too */
  entropy->saved.EOBRUN = 0;

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;

  /* Reset out-of-data flag, unless read_restart_marker left us smack up
   * against a marker.  In that case we will end up treating the next data
   * segment as empty, and we can avoid producing bogus output pixels by
   * leaving the flag set.
   */
  if (cinfo->unread_marker == 0)
    entropy->pub.insufficient_data = FALSE;

  return TRUE;
}